

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,string *item)

{
  RegularExpression *this_00;
  Snapshot snapshot;
  bool bVar1;
  ostream *poVar2;
  allocator local_229;
  string full_fw;
  string fw_path;
  string fw;
  cmOutputConverter converter;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  PositionType local_198;
  ostringstream e;
  
  this_00 = &this->SplitFramework;
  bVar1 = cmsys::RegularExpression::find(this_00,(item->_M_dataplus)._M_p);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&fw_path,this_00,1);
    cmsys::RegularExpression::match_abi_cxx11_(&fw,this_00,2);
    std::__cxx11::string::string((string *)&full_fw,(string *)&fw_path);
    std::__cxx11::string::append((char *)&full_fw);
    std::__cxx11::string::append((string *)&full_fw);
    std::__cxx11::string::append((char *)&full_fw);
    std::__cxx11::string::append((char *)&full_fw);
    std::__cxx11::string::append((string *)&full_fw);
    AddFrameworkPath(this,&fw_path);
    AddLibraryRuntimeInfo(this,&full_fw);
    std::__cxx11::string::string((string *)&converter,"-framework",&local_229);
    std::__cxx11::string::string((string *)&e,(string *)&converter);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&converter);
    cmMakefile::GetStateSnapshot(this->Makefile);
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_1a0;
    snapshot.State = (cmState *)local_1a8;
    snapshot.Position.Position = local_198;
    cmOutputConverter::cmOutputConverter(&converter,snapshot);
    cmOutputConverter::EscapeForShell((string *)&e,&converter,&fw,false,false,false);
    std::__cxx11::string::operator=((string *)&fw,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&e,(string *)&fw);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&full_fw);
    std::__cxx11::string::~string((string *)&fw);
    std::__cxx11::string::~string((string *)&fw_path);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Could not parse framework path \"");
    poVar2 = std::operator<<(poVar2,(string *)item);
    poVar2 = std::operator<<(poVar2,"\" ");
    poVar2 = std::operator<<(poVar2,"linked by target ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Target->Name);
    std::operator<<(poVar2,".");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(fw_path._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)&fw_path);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(std::string const& item)
{
  // Try to separate the framework name and path.
  if(!this->SplitFramework.find(item.c_str()))
    {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  std::string fw_path = this->SplitFramework.match(1);
  std::string fw = this->SplitFramework.match(2);
  std::string full_fw = fw_path;
  full_fw += "/";
  full_fw += fw;
  full_fw += ".framework";
  full_fw += "/";
  full_fw += fw;

  // Add the directory portion to the framework search path.
  this->AddFrameworkPath(fw_path);

  // add runtime information
  this->AddLibraryRuntimeInfo(full_fw);

  // Add the item using the -framework option.
  this->Items.push_back(Item("-framework", false));
  cmOutputConverter converter(this->Makefile->GetStateSnapshot());
  fw = converter.EscapeForShell(fw);
  this->Items.push_back(Item(fw, false));
}